

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O0

void sb_bmp_change_begin(superblock *sb)

{
  uint64_t uVar1;
  long in_RDI;
  size_t spin;
  memory_order in_stack_ffffffffffffffec;
  atomic<unsigned_long> *in_stack_fffffffffffffff0;
  atomic<unsigned_long> *atomic_val;
  
  pthread_spin_lock((pthread_spinlock_t *)(in_RDI + 0x38));
  atomic_incr_uint64_t(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  atomic_val = (atomic<unsigned_long> *)0x0;
  while (uVar1 = atomic_get_uint64_t(atomic_val,in_stack_ffffffffffffffec), uVar1 != 0) {
    atomic_val = (atomic<unsigned_long> *)
                 ((long)&(atomic_val->super___atomic_base<unsigned_long>)._M_i + 1);
  }
  return;
}

Assistant:

static void sb_bmp_change_begin(struct superblock *sb)
{
    // grab lock and increase writer count
    // now new readers cannot increase the reader count
    // (note that there is always one bitmap writer at a time)
    spin_lock(&sb->bmp_lock);
    atomic_incr_uint64_t(&sb->bmp_wcount);

    // wait until previous BMP readers terminate
    // (they are very short bitmap accessing routines so that
    //  will not take long time).
    size_t spin = 0;
    while (atomic_get_uint64_t(&sb->bmp_rcount)) {
       if (++spin > 64) {
#ifdef HAVE_SCHED_H
            sched_yield();
#elif _MSC_VER
            SwitchToThread();
#endif
       }
    }

    // now 1) all previous readers terminated
    //     2) new readers will be blocked
}